

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageSparseResidency.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sparse::anon_unknown_4::ImageSparseResidencyInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSparseResidencyInstance *this)

{
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar1;
  VkDescriptorPool descriptorPool_00;
  VkImage image;
  deUint64 dVar2;
  VkQueue pVVar3;
  VkCommandBuffer commandBuffer_00;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  Deleter<vk::Handle<(vk::HandleType)7>_> deleter;
  Deleter<vk::Handle<(vk::HandleType)7>_> deleter_00;
  Deleter<vk::Handle<(vk::HandleType)7>_> deleter_01;
  RefData<vk::Handle<(vk::HandleType)9>_> data_00;
  RefData<vk::Handle<(vk::HandleType)4>_> data_01;
  RefData<vk::Handle<(vk::HandleType)24>_> data_02;
  RefData<vk::VkCommandBuffer_s_*> data_03;
  RefData<vk::Handle<(vk::HandleType)19>_> data_04;
  RefData<vk::Handle<(vk::HandleType)14>_> data_05;
  RefData<vk::Handle<(vk::HandleType)16>_> data_06;
  RefData<vk::Handle<(vk::HandleType)18>_> data_07;
  RefData<vk::Handle<(vk::HandleType)21>_> data_08;
  RefData<vk::Handle<(vk::HandleType)22>_> data_09;
  RefData<vk::Handle<(vk::HandleType)13>_> data_10;
  RefData<vk::Handle<(vk::HandleType)8>_> data_11;
  VkImageSubresourceRange subresourceRange_02;
  bool bVar8;
  deUint32 dVar9;
  VkResult result;
  VkImageViewType imageViewType;
  VkFormat format;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice_00;
  NotSupportedError *pNVar19;
  MovePtr *vk_00;
  Queue *pQVar20;
  VkDevice pVVar21;
  Handle<(vk::HandleType)9> *pHVar22;
  const_reference pvVar23;
  Checked<vk::Handle<(vk::HandleType)7>_> CVar24;
  size_type sVar25;
  Handle<(vk::HandleType)24> *pHVar26;
  VkCommandBuffer_s **ppVVar27;
  DescriptorSetLayoutBuilder *this_00;
  ProgramCollection<vk::ProgramBinary> *this_01;
  ProgramBinary *binary;
  Handle<(vk::HandleType)19> *pHVar28;
  Handle<(vk::HandleType)16> *pHVar29;
  Handle<(vk::HandleType)14> *pHVar30;
  Handle<(vk::HandleType)18> *pHVar31;
  DescriptorPoolBuilder *this_02;
  Handle<(vk::HandleType)21> *pHVar32;
  Handle<(vk::HandleType)13> *pHVar33;
  Handle<(vk::HandleType)22> *pHVar34;
  DescriptorSetUpdateBuilder *this_03;
  Allocator *allocator;
  Handle<(vk::HandleType)8> *pHVar35;
  Handle<(vk::HandleType)4> *pWaitSemaphores;
  Allocation *pAVar36;
  VkDeviceMemory memory;
  VkDeviceSize offset_00;
  void *data_12;
  MovePtr *this_04;
  VkExtent3D VVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  VkImageAspectFlags VVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  uint local_16ac;
  uint local_169c;
  uint local_168c;
  uint local_1658;
  uint local_1650;
  uint local_1648;
  deUint32 local_1514;
  deUint32 local_150c;
  uint local_1364;
  uint local_1354;
  uint local_1344;
  uint local_12e0;
  uint local_12d8;
  uint local_12d0;
  allocator<char> local_11e1;
  string local_11e0;
  allocator<char> local_11b9;
  string local_11b8;
  undefined1 local_1194 [8];
  UVec4 outputValue_2;
  UVec4 referenceValue_2;
  deUint32 offsetX_2;
  deUint32 offsetY_2;
  deUint32 offsetZ_2;
  uint local_1158;
  uint uStack_1154;
  VkExtent3D mipExtent_2;
  undefined1 local_1128 [8];
  UVec4 outputValue_1;
  UVec4 referenceValue_1;
  deUint32 offsetX_1;
  deUint32 offsetY_1;
  deUint32 offsetZ_1;
  undefined1 local_10d8 [8];
  UVec4 outputValue;
  UVec4 referenceValue;
  deUint32 offsetX;
  deUint32 offsetY;
  deUint32 offsetZ;
  deUint32 linearIndex_1;
  VkExtent3D extent_1;
  VkExtent3D offset_1;
  deUint32 x_1;
  deUint32 y_1;
  deUint32 z_1;
  deUint32 layerNdx_1;
  UVec3 lastBlockExtent_1;
  UVec3 numSparseBinds_1;
  undefined1 local_1058 [8];
  VkExtent3D mipExtent_1;
  ConstPixelBufferAccess pixelBuffer;
  deUint8 *outputData;
  VkPipelineStageFlags local_100c;
  VkBuffer VStack_1008;
  VkPipelineStageFlags stageBits [1];
  undefined1 local_1000 [8];
  VkBufferMemoryBarrier outputBufferHostReadBarrier;
  undefined1 local_f98 [8];
  VkBufferImageCopy bufferImageCopy;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_f50;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_f40;
  undefined1 local_f30 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> outputBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_f00;
  undefined1 local_ee0 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> outputBuffer;
  VkBufferCreateInfo outputBufferCreateInfo;
  deUint32 imageSizeInBytes;
  undefined1 local_e50 [8];
  VkImageMemoryBarrier sparseImageTrasferBarrier;
  UVec3 maxComputeWorkGroupCount;
  deUint32 zWorkGroupCount;
  deUint32 yWorkGroupCount;
  deUint32 xWorkGroupCount;
  UVec3 workGroupSize;
  UVec3 gridSize;
  undefined1 local_db8 [8];
  VkImageMemoryBarrier sparseImageLayoutChangeBarrier;
  Location local_d68;
  VkDescriptorSet local_d60;
  DescriptorSetUpdateBuilder local_d58;
  deUint64 local_d10;
  VkSampler local_d08;
  undefined1 local_d00 [8];
  VkDescriptorImageInfo sparseImageInfo;
  Move<vk::Handle<(vk::HandleType)13>_> local_cc8;
  RefData<vk::Handle<(vk::HandleType)13>_> local_ca8;
  undefined1 local_c88 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> imageView;
  undefined4 uStack_c60;
  VkImageSubresourceRange subresourceRange;
  Move<vk::Handle<(vk::HandleType)22>_> local_c40;
  RefData<vk::Handle<(vk::HandleType)22>_> local_c20;
  undefined1 local_c00 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_bc8;
  RefData<vk::Handle<(vk::HandleType)21>_> local_ba8;
  undefined1 local_b88 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_b50;
  RefData<vk::Handle<(vk::HandleType)18>_> local_b30;
  undefined1 local_b10 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> computePipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_ae8;
  RefData<vk::Handle<(vk::HandleType)16>_> local_ac8;
  undefined1 local_aa8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  string local_a80;
  Move<vk::Handle<(vk::HandleType)14>_> local_a60;
  RefData<vk::Handle<(vk::HandleType)14>_> local_a40;
  undefined1 local_a20 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  Move<vk::Handle<(vk::HandleType)19>_> local_9b8;
  RefData<vk::Handle<(vk::HandleType)19>_> local_998;
  undefined1 local_978 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  Move<vk::VkCommandBuffer_s_*> local_950;
  RefData<vk::VkCommandBuffer_s_*> local_930;
  undefined1 local_910 [8];
  Unique<vk::VkCommandBuffer_s_*> commandBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_8d0;
  undefined1 local_8b0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> commandPool;
  undefined1 local_888 [8];
  VkSparseImageOpaqueMemoryBindInfo imageMipTailBindInfo;
  VkSparseImageMemoryBindInfo imageResidencyBindInfo;
  VkBindSparseInfo bindSparseInfo;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  Move<vk::Handle<(vk::HandleType)7>_> local_7d0;
  value_type local_7b0;
  undefined1 local_7a0 [8];
  VkSparseMemoryBind imageMipTailMemoryBind_1;
  undefined8 uStack_770;
  undefined8 local_768;
  Move<vk::Handle<(vk::HandleType)7>_> local_750;
  value_type local_730;
  undefined1 local_720 [8];
  VkSparseMemoryBind imageMipTailMemoryBind;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  Move<vk::Handle<(vk::HandleType)7>_> local_6d0;
  value_type local_6b0;
  undefined1 local_6a0 [8];
  VkSparseImageMemoryBind imageMemoryBind;
  VkExtent3D extent;
  VkOffset3D offset;
  deUint32 linearIndex;
  deUint32 x;
  deUint32 y;
  deUint32 z;
  UVec3 lastBlockExtent;
  UVec3 numSparseBinds;
  undefined1 local_610 [8];
  VkExtent3D mipExtent;
  VkImageSubresource subresource;
  deUint32 mipLevelNdx;
  deUint32 layerNdx;
  string local_5e8;
  deUint32 local_5c4;
  undefined1 local_5c0 [4];
  deUint32 memoryType;
  vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> imageMipTailMemoryBinds;
  vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
  imageResidencyMemoryBinds;
  VkImageAspectFlags aspectMask;
  deUint32 colorAspectIndex;
  undefined1 local_580 [8];
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  sparseMemoryRequirements;
  undefined1 local_560 [8];
  VkMemoryRequirements imageMemoryRequirements;
  RefData<vk::Handle<(vk::HandleType)4>_> local_528;
  undefined1 local_508 [8];
  Unique<vk::Handle<(vk::HandleType)4>_> imageMemoryBindSemaphore;
  RefData<vk::Handle<(vk::HandleType)9>_> local_4c8;
  undefined1 local_4a8 [8];
  Unique<vk::Handle<(vk::HandleType)9>_> sparseImage;
  Queue *computeQueue;
  Queue *sparseQueue;
  DeviceInterface *deviceInterface;
  QueueRequirements local_468;
  undefined1 local_460 [8];
  QueueRequirementsVec queueRequirements;
  UVec3 local_434;
  pointer local_428;
  deUint32 local_420;
  undefined1 local_410 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  VkExtent3D imageGranularity;
  undefined4 uStack_3e4;
  VkSparseImageMemoryRequirements aspectRequirements;
  VkImageCreateInfo imageCreateInfo;
  VkPhysicalDeviceProperties physicalDeviceProperties;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *instance;
  ImageSparseResidencyInstance *this_local;
  
  vk = Context::getInstanceInterface
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice_00 =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceProperties
            ((VkPhysicalDeviceProperties *)&imageCreateInfo.initialLayout,vk,physicalDevice_00);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
            *)local_410);
  bVar8 = isImageSizeSupported(vk,physicalDevice_00,this->m_imageType,&this->m_imageSize);
  if (!bVar8) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar19,"Image size not supported for device",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0xd0);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  bVar8 = checkSparseSupportForImageType(vk,physicalDevice_00,this->m_imageType);
  if (!bVar8) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar19,"Sparse residency for image type is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0xd4);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  aspectRequirements.imageMipTailStride._0_4_ = 0xe;
  imageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageCreateInfo._4_4_ = 0;
  imageCreateInfo.pNext._0_4_ = 3;
  imageCreateInfo.pNext._4_4_ = mapImageType(this->m_imageType);
  imageCreateInfo.flags = ::vk::mapTextureFormat(&this->m_format);
  getLayerSize((sparse *)&local_434,this->m_imageType,&this->m_imageSize);
  VVar37 = ::vk::makeExtent3D(&local_434);
  local_420 = VVar37.depth;
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = VVar37._0_8_;
  imageCreateInfo.extent.height = 1;
  local_428 = queueRequirements.
              super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  imageCreateInfo._20_8_ =
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  imageCreateInfo.extent.width = local_420;
  imageCreateInfo.extent.depth = getNumLayers(this->m_imageType,&this->m_imageSize);
  imageCreateInfo.mipLevels = 1;
  imageCreateInfo.arrayLayers = 0;
  imageCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  imageCreateInfo.samples = VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_1_BIT;
  imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageCreateInfo.usage = 0;
  imageCreateInfo.queueFamilyIndexCount = 0;
  imageCreateInfo._68_4_ = 0;
  if ((this->m_imageType == IMAGE_TYPE_CUBE) || (this->m_imageType == IMAGE_TYPE_CUBE_ARRAY)) {
    imageCreateInfo.pNext._0_4_ = (uint)imageCreateInfo.pNext | 0x10;
  }
  bVar8 = checkSparseSupportForImageFormat
                    (vk,physicalDevice_00,
                     (VkImageCreateInfo *)&aspectRequirements.imageMipTailStride);
  if (!bVar8) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar19,"The image format does not support sparse operations",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0xee);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  vector((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_> *)
         local_460);
  QueueRequirements::QueueRequirements(&local_468,8,1);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  push_back((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             *)local_460,&local_468);
  QueueRequirements::QueueRequirements((QueueRequirements *)&deviceInterface,2,1);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  push_back((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             *)local_460,(value_type *)&deviceInterface);
  SparseResourcesBaseInstance::createDeviceSupportingQueues
            (&this->super_SparseResourcesBaseInstance,(QueueRequirementsVec *)local_460);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  ~vector((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_> *
          )local_460);
  vk_00 = (MovePtr *)
          SparseResourcesBaseInstance::getDeviceInterface(&this->super_SparseResourcesBaseInstance);
  pQVar20 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0);
  sparseImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,2,0);
  pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)
                    &imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.
                     deleter.m_allocator,(DeviceInterface *)vk_00,pVVar21,
                    (VkImageCreateInfo *)&aspectRequirements.imageMipTailStride,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_4c8,
             (Move *)&imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.
                      deleter.m_allocator);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_4c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_4c8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4c8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_4c8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_4c8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_4c8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_4c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_4a8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
              m_allocator);
  pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&imageMemoryRequirements.memoryTypeBits,
             (DeviceInterface *)vk_00,pVVar21,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_528,(Move *)&imageMemoryRequirements.memoryTypeBits);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_528.deleter.m_deviceIface;
  data_01.object.m_internal = local_528.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_528.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_528.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_528.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_528.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_528.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_508,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&imageMemoryRequirements.memoryTypeBits);
  pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_4a8);
  sparseMemoryRequirements.
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar22->m_internal;
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)local_560,(DeviceInterface *)vk_00,pVVar21,
             (VkImage)sparseMemoryRequirements.
                      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (physicalDeviceProperties.limits.bufferImageGranularity < (ulong)local_560) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar19,"Required memory size for sparse resource exceeds device limits",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0x108);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_4a8);
  ::vk::getImageSparseMemoryRequirements
            ((vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
              *)local_580,(DeviceInterface *)vk_00,pVVar21,(VkImage)pHVar22->m_internal);
  dVar9 = getSparseAspectRequirementsIndex
                    ((vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                      *)local_580,1);
  if (dVar9 == 0xffffffff) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar19,
               "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0x114);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pvVar23 = std::
            vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
            ::operator[]((vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                          *)local_580,(ulong)dVar9);
  uVar4 = (pvVar23->formatProperties).aspectMask;
  uVar5 = (pvVar23->formatProperties).imageGranularity.width;
  uVar6 = (pvVar23->formatProperties).imageGranularity.height;
  uVar7 = (pvVar23->formatProperties).imageGranularity.depth;
  aspectRequirements.formatProperties.imageGranularity._4_8_ =
       *(undefined8 *)&(pvVar23->formatProperties).flags;
  aspectRequirements._16_8_ = pvVar23->imageMipTailSize;
  aspectRequirements.imageMipTailSize = pvVar23->imageMipTailOffset;
  aspectRequirements.imageMipTailOffset = pvVar23->imageMipTailStride;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(uVar6,uVar5);
  aspectRequirements.formatProperties.aspectMask = uVar6;
  aspectRequirements.formatProperties.imageGranularity.width = uVar7;
  std::vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>::vector
            ((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_> *)
             &imageMipTailMemoryBinds.
              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::vector
            ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)local_5c0);
  local_5c4 = findMatchingMemoryType
                        (vk,physicalDevice_00,(VkMemoryRequirements *)local_560,
                         (MemoryRequirement *)&::vk::MemoryRequirement::Any);
  if (local_5c4 == 0xffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e8,"No matching memory type found",
               (allocator<char> *)((long)&layerNdx + 3));
    tcu::TestStatus::fail(__return_storage_ptr__,&local_5e8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&layerNdx + 3));
    bVar8 = true;
  }
  else {
    for (subresource.arrayLayer = 0; subresource.arrayLayer < imageCreateInfo.extent.depth;
        subresource.arrayLayer = subresource.arrayLayer + 1) {
      for (subresource.mipLevel = 0;
          subresource.mipLevel < aspectRequirements.formatProperties.imageGranularity.depth;
          subresource.mipLevel = subresource.mipLevel + 1) {
        mipExtent.height = uVar4;
        mipExtent.depth = subresource.mipLevel;
        VVar37 = mipLevelExtents((VkExtent3D *)&imageCreateInfo.imageType,subresource.mipLevel);
        mipExtent.width = VVar37.depth;
        local_610 = VVar37._0_8_;
        alignedDivide((anon_unknown_4 *)(lastBlockExtent.m_data + 1),(VkExtent3D *)local_610,
                      (VkExtent3D *)
                      &deviceMemUniquePtrVec.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((uint)local_610._0_4_ %
            (uint)deviceMemUniquePtrVec.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
          local_12d0 = (uint)deviceMemUniquePtrVec.
                             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          local_12d0 = (uint)local_610._0_4_ %
                       (uint)deviceMemUniquePtrVec.
                             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        if ((uint)local_610._4_4_ %
            deviceMemUniquePtrVec.
            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          local_12d8 = deviceMemUniquePtrVec.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        else {
          local_12d8 = (uint)local_610._4_4_ %
                       deviceMemUniquePtrVec.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        if (mipExtent.width % (uint)uVar7 == 0) {
          local_12e0 = uVar7;
        }
        else {
          local_12e0 = mipExtent.width % (uint)uVar7;
        }
        tcu::Vector<unsigned_int,_3>::Vector
                  ((Vector<unsigned_int,_3> *)&y,local_12d0,local_12d8,local_12e0);
        for (x = 0; uVar10 = tcu::Vector<unsigned_int,_3>::z
                                       ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1)),
            x < uVar10; x = x + 1) {
          for (linearIndex = 0;
              uVar10 = tcu::Vector<unsigned_int,_3>::y
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1)),
              linearIndex < uVar10; linearIndex = linearIndex + 1) {
            for (offset.z = 0;
                uVar10 = tcu::Vector<unsigned_int,_3>::x
                                   ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1)),
                (uint)offset.z < uVar10; offset.z = offset.z + 1) {
              uVar10 = tcu::Vector<unsigned_int,_3>::x
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
              uVar11 = tcu::Vector<unsigned_int,_3>::x
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
              uVar12 = tcu::Vector<unsigned_int,_3>::y
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
              uVar13 = tcu::Vector<unsigned_int,_3>::x
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
              uVar14 = tcu::Vector<unsigned_int,_3>::y
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
              uVar15 = tcu::Vector<unsigned_int,_3>::z
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
              if ((offset.z + linearIndex * uVar10 + x * uVar11 * uVar12 +
                   subresource.arrayLayer * uVar13 * uVar14 * uVar15 & 1) != 1) {
                extent.height =
                     offset.z *
                     (uint)deviceMemUniquePtrVec.
                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                extent.depth = linearIndex *
                               deviceMemUniquePtrVec.
                               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                uVar10 = tcu::Vector<unsigned_int,_3>::x
                                   ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
                if (offset.z == uVar10 - 1) {
                  local_1344 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&y);
                }
                else {
                  local_1344 = (uint)deviceMemUniquePtrVec.
                                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                imageMemoryBind.flags = local_1344;
                uVar10 = tcu::Vector<unsigned_int,_3>::y
                                   ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
                if (linearIndex == uVar10 - 1) {
                  local_1354 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&y);
                }
                else {
                  local_1354 = deviceMemUniquePtrVec.
                               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                }
                imageMemoryBind._60_4_ = local_1354;
                uVar10 = tcu::Vector<unsigned_int,_3>::z
                                   ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
                if (x == uVar10 - 1) {
                  local_1364 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)&y);
                }
                else {
                  local_1364 = uVar7;
                }
                extent.width = local_1364;
                pVVar21 = SparseResourcesBaseInstance::getDevice
                                    (&this->super_SparseResourcesBaseInstance);
                makeSparseImageMemoryBind
                          ((VkSparseImageMemoryBind *)local_6a0,(DeviceInterface *)vk_00,pVVar21,
                           imageMemoryRequirements.size,local_5c4,
                           (VkImageSubresource *)&mipExtent.height,(VkOffset3D *)&extent.height,
                           (VkExtent3D *)&imageMemoryBind.flags);
                CVar24 = ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                                   ((Handle<(vk::HandleType)7>)imageMemoryBind._32_8_);
                pVVar21 = SparseResourcesBaseInstance::getDevice
                                    (&this->super_SparseResourcesBaseInstance);
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::Deleter
                          ((Deleter<vk::Handle<(vk::HandleType)7>_> *)&imageMipTailMemoryBind.flags,
                           (DeviceInterface *)vk_00,pVVar21,(VkAllocationCallbacks *)0x0);
                deleter.m_device._0_4_ = (int)uStack_6f0;
                deleter.m_deviceIface = (DeviceInterface *)imageMipTailMemoryBind._32_8_;
                deleter.m_device._4_4_ = (int)((ulong)uStack_6f0 >> 0x20);
                deleter.m_allocator._0_4_ = (int)local_6e8;
                deleter.m_allocator._4_4_ = (int)((ulong)local_6e8 >> 0x20);
                ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>>::
                Move<vk::Handle<(vk::HandleType)7>>
                          ((Move<vk::Handle<(vk::HandleType)7>> *)&local_6d0,CVar24,deleter);
                makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>((sparse *)&local_6b0,&local_6d0);
                std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                             *)local_410,&local_6b0);
                de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr
                          (&local_6b0);
                ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_6d0);
                std::
                vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>::
                push_back((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                           *)&imageMipTailMemoryBinds.
                              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)local_6a0);
              }
            }
          }
        }
      }
      if (((aspectRequirements.formatProperties.imageGranularity._4_8_ & 1) == 0) &&
         (aspectRequirements.formatProperties.imageGranularity.depth < imageCreateInfo.extent.height
         )) {
        pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
        makeSparseMemoryBind
                  ((VkSparseMemoryBind *)local_720,(DeviceInterface *)vk_00,pVVar21,
                   aspectRequirements._16_8_,local_5c4,
                   aspectRequirements.imageMipTailSize +
                   subresource.arrayLayer * aspectRequirements.imageMipTailOffset);
        CVar24 = ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                           ((Handle<(vk::HandleType)7>)imageMipTailMemoryBind.size);
        pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::Deleter
                  ((Deleter<vk::Handle<(vk::HandleType)7>_> *)&imageMipTailMemoryBind_1.flags,
                   (DeviceInterface *)vk_00,pVVar21,(VkAllocationCallbacks *)0x0);
        deleter_00.m_device._0_4_ = (int)uStack_770;
        deleter_00.m_deviceIface = (DeviceInterface *)imageMipTailMemoryBind_1._32_8_;
        deleter_00.m_device._4_4_ = (int)((ulong)uStack_770 >> 0x20);
        deleter_00.m_allocator._0_4_ = (int)local_768;
        deleter_00.m_allocator._4_4_ = (int)((ulong)local_768 >> 0x20);
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>>::Move<vk::Handle<(vk::HandleType)7>>
                  ((Move<vk::Handle<(vk::HandleType)7>> *)&local_750,CVar24,deleter_00);
        makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>((sparse *)&local_730,&local_750);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
        ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                     *)local_410,&local_730);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr
                  (&local_730);
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_750);
        std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
                  ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                   local_5c0,(value_type *)local_720);
      }
    }
    if (((aspectRequirements.formatProperties.imageGranularity._4_8_ & 1) != 0) &&
       (aspectRequirements.formatProperties.imageGranularity.depth < imageCreateInfo.extent.height))
    {
      pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      makeSparseMemoryBind
                ((VkSparseMemoryBind *)local_7a0,(DeviceInterface *)vk_00,pVVar21,
                 aspectRequirements._16_8_,local_5c4,aspectRequirements.imageMipTailSize);
      CVar24 = ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                         ((Handle<(vk::HandleType)7>)imageMipTailMemoryBind_1.size);
      pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::Deleter
                ((Deleter<vk::Handle<(vk::HandleType)7>_> *)&bindSparseInfo.pSignalSemaphores,
                 (DeviceInterface *)vk_00,pVVar21,(VkAllocationCallbacks *)0x0);
      deleter_01.m_device._0_4_ = (int)uStack_7f0;
      deleter_01.m_deviceIface = (DeviceInterface *)bindSparseInfo.pSignalSemaphores;
      deleter_01.m_device._4_4_ = (int)((ulong)uStack_7f0 >> 0x20);
      deleter_01.m_allocator._0_4_ = (int)local_7e8;
      deleter_01.m_allocator._4_4_ = (int)((ulong)local_7e8 >> 0x20);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>>::Move<vk::Handle<(vk::HandleType)7>>
                ((Move<vk::Handle<(vk::HandleType)7>> *)&local_7d0,CVar24,deleter_01);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>((sparse *)&local_7b0,&local_7d0);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
      ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                   *)local_410,&local_7b0);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr(&local_7b0)
      ;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_7d0);
      std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
                ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                 local_5c0,(value_type *)local_7a0);
    }
    bindSparseInfo.signalSemaphoreCount = 0;
    bindSparseInfo._84_4_ = 0;
    bindSparseInfo.pImageOpaqueBinds = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
    bindSparseInfo.imageBindCount = 0;
    bindSparseInfo._68_4_ = 0;
    bindSparseInfo.pBufferBinds = (VkSparseBufferMemoryBindInfo *)0x0;
    bindSparseInfo.imageOpaqueBindCount = 0;
    bindSparseInfo._52_4_ = 0;
    bindSparseInfo.pWaitSemaphores = (VkSemaphore *)0x0;
    bindSparseInfo.bufferBindCount = 0;
    bindSparseInfo._36_4_ = 0;
    bindSparseInfo.pNext = (void *)0x0;
    bindSparseInfo.waitSemaphoreCount = 0;
    bindSparseInfo._20_4_ = 0;
    bindSparseInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    bindSparseInfo._4_4_ = 0;
    imageResidencyBindInfo.pBinds = (VkSparseImageMemoryBind *)0x7;
    bindSparseInfo.pImageBinds = (VkSparseImageMemoryBindInfo *)0x1;
    bindSparseInfo._80_8_ =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                   ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_508);
    ::vk::VkSparseImageMemoryBindInfo::VkSparseImageMemoryBindInfo
              ((VkSparseImageMemoryBindInfo *)&imageMipTailBindInfo.pBinds);
    ::vk::VkSparseImageOpaqueMemoryBindInfo::VkSparseImageOpaqueMemoryBindInfo
              ((VkSparseImageOpaqueMemoryBindInfo *)local_888);
    sVar25 = std::vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
             ::size((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                     *)&imageMipTailMemoryBinds.
                        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar25 != 0) {
      pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_4a8);
      imageMipTailBindInfo.pBinds = (VkSparseMemoryBind *)pHVar22->m_internal;
      sVar25 = std::
               vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>::
               size((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                     *)&imageMipTailMemoryBinds.
                        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      imageResidencyBindInfo.image.m_internal._0_4_ = (undefined4)sVar25;
      imageResidencyBindInfo._8_8_ =
           std::vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>::
           operator[]((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                       *)&imageMipTailMemoryBinds.
                          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      bindSparseInfo.pImageOpaqueBinds =
           (VkSparseImageOpaqueMemoryBindInfo *)CONCAT44(bindSparseInfo.pImageOpaqueBinds._4_4_,1);
      bindSparseInfo._64_8_ = &imageMipTailBindInfo.pBinds;
    }
    sVar25 = std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::size
                       ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                        local_5c0);
    if (sVar25 != 0) {
      pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_4a8);
      local_888 = (undefined1  [8])pHVar22->m_internal;
      sVar25 = std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::size
                         ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *
                          )local_5c0);
      imageMipTailBindInfo.image.m_internal._0_4_ = (undefined4)sVar25;
      imageMipTailBindInfo._8_8_ =
           std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::operator[]
                     ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                      local_5c0,0);
      bindSparseInfo.pBufferBinds =
           (VkSparseBufferMemoryBindInfo *)CONCAT44(bindSparseInfo.pBufferBinds._4_4_,1);
      bindSparseInfo._48_8_ = local_888;
    }
    pVVar3 = pQVar20->queueHandle;
    ::vk::Handle<(vk::HandleType)6>::Handle
              ((Handle<(vk::HandleType)6> *)
               &commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                m_allocator,0);
    result = (*(*(_func_int ***)vk_00)[0x11])(vk_00,pVVar3,1,&imageResidencyBindInfo.pBinds);
    ::vk::checkResult(result,
                      "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                      ,0x18b);
    bVar8 = false;
  }
  std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::~vector
            ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)local_5c0);
  std::vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>::~vector
            ((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_> *)
             &imageMipTailMemoryBinds.
              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ::~vector((vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             *)local_580);
  if (!bVar8) {
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                    &commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                    (DeviceInterface *)vk_00,pVVar21,
                    *(deUint32 *)
                     &(sparseImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                      m_allocator)->pfnAllocation);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_8d0,
               (Move *)&commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    data_02.deleter.m_deviceIface._0_4_ = (int)local_8d0.deleter.m_deviceIface;
    data_02.object.m_internal = local_8d0.object.m_internal;
    data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_8d0.deleter.m_deviceIface >> 0x20);
    data_02.deleter.m_device._0_4_ = (int)local_8d0.deleter.m_device;
    data_02.deleter.m_device._4_4_ = (int)((ulong)local_8d0.deleter.m_device >> 0x20);
    data_02.deleter.m_allocator._0_4_ = (int)local_8d0.deleter.m_allocator;
    data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_8d0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_8b0,data_02);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pHVar26 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_8b0);
    descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar26->m_internal;
    ::vk::allocateCommandBuffer
              (&local_950,(DeviceInterface *)vk_00,pVVar21,
               (VkCommandPool)
               descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
               m_allocator,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_930,(Move *)&local_950);
    data_03.deleter.m_deviceIface._0_4_ = (int)local_930.deleter.m_deviceIface;
    data_03.object = local_930.object;
    data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_930.deleter.m_deviceIface >> 0x20);
    data_03.deleter.m_device._0_4_ = (int)local_930.deleter.m_device;
    data_03.deleter.m_device._4_4_ = (int)((ulong)local_930.deleter.m_device >> 0x20);
    data_03.deleter.m_pool.m_internal._0_4_ = (int)local_930.deleter.m_pool.m_internal;
    data_03.deleter.m_pool.m_internal._4_4_ = (int)(local_930.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_910,data_03);
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_950);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
    beginCommandBuffer((DeviceInterface *)vk_00,*ppVVar27);
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)
               &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                m_allocator);
    this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                        ((DescriptorSetLayoutBuilder *)
                         &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
                          .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::DescriptorSetLayoutBuilder::build(&local_9b8,this_00,(DeviceInterface *)vk_00,pVVar21,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_998,(Move *)&local_9b8);
    data_04.deleter.m_deviceIface._0_4_ = (int)local_998.deleter.m_deviceIface;
    data_04.object.m_internal = local_998.object.m_internal;
    data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_998.deleter.m_deviceIface >> 0x20);
    data_04.deleter.m_device._0_4_ = (int)local_998.deleter.m_device;
    data_04.deleter.m_device._4_4_ = (int)((ulong)local_998.deleter.m_device >> 0x20);
    data_04.deleter.m_allocator._0_4_ = (int)local_998.deleter.m_allocator;
    data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_998.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_978,data_04);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_9b8);
    ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)
               &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                m_allocator);
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    this_01 = Context::getBinaryCollection
                        ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a80,"comp",
               (allocator<char> *)
               ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                       m_allocator + 7));
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_01,&local_a80);
    ::vk::createShaderModule(&local_a60,(DeviceInterface *)vk_00,pVVar21,binary,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_a40,(Move *)&local_a60);
    data_05.deleter.m_deviceIface._0_4_ = (int)local_a40.deleter.m_deviceIface;
    data_05.object.m_internal = local_a40.object.m_internal;
    data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a40.deleter.m_deviceIface >> 0x20);
    data_05.deleter.m_device._0_4_ = (int)local_a40.deleter.m_device;
    data_05.deleter.m_device._4_4_ = (int)((ulong)local_a40.deleter.m_device >> 0x20);
    data_05.deleter.m_allocator._0_4_ = (int)local_a40.deleter.m_allocator;
    data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_a40.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a20,data_05);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_a60);
    std::__cxx11::string::~string((string *)&local_a80);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                       m_allocator + 7));
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_978);
    computePipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar28->m_internal;
    makePipelineLayout(&local_ae8,(DeviceInterface *)vk_00,pVVar21,
                       (VkDescriptorSetLayout)
                       computePipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter
                       .m_allocator);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_ac8,(Move *)&local_ae8);
    data_06.deleter.m_deviceIface._0_4_ = (int)local_ac8.deleter.m_deviceIface;
    data_06.object.m_internal = local_ac8.object.m_internal;
    data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_ac8.deleter.m_deviceIface >> 0x20);
    data_06.deleter.m_device._0_4_ = (int)local_ac8.deleter.m_device;
    data_06.deleter.m_device._4_4_ = (int)((ulong)local_ac8.deleter.m_device >> 0x20);
    data_06.deleter.m_allocator._0_4_ = (int)local_ac8.deleter.m_allocator;
    data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_ac8.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_aa8,data_06);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_ae8);
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pHVar29 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_aa8);
    pipelineLayout_00.m_internal = pHVar29->m_internal;
    pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_a20);
    makeComputePipeline(&local_b50,(DeviceInterface *)vk_00,pVVar21,pipelineLayout_00,
                        (VkShaderModule)pHVar30->m_internal,(VkSpecializationInfo *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_b30,(Move *)&local_b50);
    data_07.deleter.m_deviceIface._0_4_ = (int)local_b30.deleter.m_deviceIface;
    data_07.object.m_internal = local_b30.object.m_internal;
    data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_b30.deleter.m_deviceIface >> 0x20);
    data_07.deleter.m_device._0_4_ = (int)local_b30.deleter.m_device;
    data_07.deleter.m_device._4_4_ = (int)((ulong)local_b30.deleter.m_device >> 0x20);
    data_07.deleter.m_allocator._0_4_ = (int)local_b30.deleter.m_allocator;
    data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_b30.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_b10,data_07);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_b50);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
    pVVar1 = *ppVVar27;
    pHVar31 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_b10);
    descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar31->m_internal;
    (*(*(_func_int ***)vk_00)[0x4c])
              (vk_00,pVVar1,1,
               descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
               m_allocator);
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
              ((DescriptorPoolBuilder *)
               &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
    this_02 = ::vk::DescriptorPoolBuilder::addType
                        ((DescriptorPoolBuilder *)
                         &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                          deleter.m_pool,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::DescriptorPoolBuilder::build(&local_bc8,this_02,(DeviceInterface *)vk_00,pVVar21,1,1);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_ba8,(Move *)&local_bc8);
    data_08.deleter.m_deviceIface._0_4_ = (int)local_ba8.deleter.m_deviceIface;
    data_08.object.m_internal = local_ba8.object.m_internal;
    data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_ba8.deleter.m_deviceIface >> 0x20);
    data_08.deleter.m_device._0_4_ = (int)local_ba8.deleter.m_device;
    data_08.deleter.m_device._4_4_ = (int)((ulong)local_ba8.deleter.m_device >> 0x20);
    data_08.deleter.m_allocator._0_4_ = (int)local_ba8.deleter.m_allocator;
    data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_ba8.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_b88,data_08);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_bc8);
    ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
              ((DescriptorPoolBuilder *)
               &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pHVar32 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_b88);
    descriptorPool_00.m_internal = pHVar32->m_internal;
    pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_978);
    makeDescriptorSet(&local_c40,(DeviceInterface *)vk_00,pVVar21,descriptorPool_00,
                      (VkDescriptorSetLayout)pHVar28->m_internal);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_c20,(Move *)&local_c40);
    data_09.deleter.m_deviceIface._0_4_ = (int)local_c20.deleter.m_deviceIface;
    data_09.object.m_internal = local_c20.object.m_internal;
    data_09.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c20.deleter.m_deviceIface >> 0x20);
    data_09.deleter.m_device._0_4_ = (int)local_c20.deleter.m_device;
    data_09.deleter.m_device._4_4_ = (int)((ulong)local_c20.deleter.m_device >> 0x20);
    data_09.deleter.m_pool.m_internal._0_4_ = (int)local_c20.deleter.m_pool.m_internal;
    data_09.deleter.m_pool.m_internal._4_4_ = (int)(local_c20.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_c00,data_09);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_c40);
    dVar9 = getNumLayers(this->m_imageType,&this->m_imageSize);
    ::vk::makeImageSubresourceRange
              ((VkImageSubresourceRange *)
               ((long)&imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator + 4),1,0,1,0,dVar9);
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_4a8);
    image.m_internal = pHVar22->m_internal;
    imageViewType = mapImageViewType(this->m_imageType);
    format = ::vk::mapTextureFormat(&this->m_format);
    sparseImageInfo.imageLayout =
         imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._4_4_;
    sparseImageInfo._20_4_ = uStack_c60;
    VVar40 = subresourceRange.aspectMask;
    dVar9 = subresourceRange.baseMipLevel;
    subresourceRange_00.levelCount = VVar40;
    subresourceRange_00.aspectMask =
         imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._4_4_;
    subresourceRange_00.baseMipLevel = uStack_c60;
    subresourceRange_00.baseArrayLayer = dVar9;
    subresourceRange_00.layerCount = subresourceRange.levelCount;
    makeImageView(&local_cc8,(DeviceInterface *)vk_00,pVVar21,image,imageViewType,format,
                  subresourceRange_00);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_ca8,(Move *)&local_cc8);
    data_10.deleter.m_deviceIface._0_4_ = (int)local_ca8.deleter.m_deviceIface;
    data_10.object.m_internal = local_ca8.object.m_internal;
    data_10.deleter.m_deviceIface._4_4_ = (int)((ulong)local_ca8.deleter.m_deviceIface >> 0x20);
    data_10.deleter.m_device._0_4_ = (int)local_ca8.deleter.m_device;
    data_10.deleter.m_device._4_4_ = (int)((ulong)local_ca8.deleter.m_device >> 0x20);
    data_10.deleter.m_allocator._0_4_ = (int)local_ca8.deleter.m_allocator;
    data_10.deleter.m_allocator._4_4_ = (int)((ulong)local_ca8.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_c88,data_10);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_cc8);
    ::vk::Handle<(vk::HandleType)20>::Handle(&local_d08,0);
    pHVar33 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_c88);
    local_d10 = pHVar33->m_internal;
    ::vk::makeDescriptorImageInfo
              ((VkDescriptorImageInfo *)local_d00,local_d08,(VkImageView)local_d10,
               VK_IMAGE_LAYOUT_GENERAL);
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_d58);
    pHVar34 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_c00);
    local_d60.m_internal = pHVar34->m_internal;
    local_d68 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    this_03 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        (&local_d58,local_d60,&local_d68,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                         (VkDescriptorImageInfo *)local_d00);
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::DescriptorSetUpdateBuilder::update(this_03,(DeviceInterface *)vk_00,pVVar21);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_d58);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
    pVVar1 = *ppVVar27;
    pHVar29 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_aa8);
    sparseImageLayoutChangeBarrier._64_8_ = pHVar29->m_internal;
    pHVar34 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                        ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_c00);
    (*(*(_func_int ***)vk_00)[0x56])
              (vk_00,pVVar1,1,sparseImageLayoutChangeBarrier._64_8_,0,1,(int)pHVar34,0,0);
    if (pQVar20->queueFamilyIndex ==
        *(deUint32 *)
         &(sparseImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator)->
          pfnAllocation) {
      local_150c = 0xffffffff;
    }
    else {
      local_150c = pQVar20->queueFamilyIndex;
    }
    if (pQVar20->queueFamilyIndex ==
        *(deUint32 *)
         &(sparseImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator)->
          pfnAllocation) {
      local_1514 = 0xffffffff;
    }
    else {
      local_1514 = *(deUint32 *)
                    &(sparseImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                     m_allocator)->pfnAllocation;
    }
    pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_4a8);
    subresourceRange_02.levelCount = VVar40;
    subresourceRange_02.aspectMask =
         imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._4_4_;
    subresourceRange_02.baseMipLevel = uStack_c60;
    subresourceRange_02.baseArrayLayer = dVar9;
    subresourceRange_02.layerCount = subresourceRange.levelCount;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)local_db8,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
               VK_IMAGE_LAYOUT_GENERAL,local_150c,local_1514,(VkImage)pHVar22->m_internal,
               subresourceRange_02);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
    (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar27,1,0x800,0,0,0,0,0,1,(int)local_db8);
    getShaderGridSize((sparse *)(workGroupSize.m_data + 1),this->m_imageType,&this->m_imageSize,0);
    computeWorkGroupSize((anon_unknown_4 *)&yWorkGroupCount,(UVec3 *)(workGroupSize.m_data + 1));
    uVar10 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar11 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&yWorkGroupCount);
    uVar12 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar13 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&yWorkGroupCount);
    uVar10 = (uVar10 / uVar11 + 1) - (uint)(uVar12 % uVar13 == 0);
    uVar11 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar12 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&yWorkGroupCount);
    uVar13 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar14 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&yWorkGroupCount);
    uVar11 = (uVar11 / uVar12 + 1) - (uint)(uVar13 % uVar14 == 0);
    uVar12 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar13 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)&yWorkGroupCount);
    uVar14 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar15 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)&yWorkGroupCount);
    uVar12 = (uVar12 / uVar13 + 1) - (uint)(uVar14 % uVar15 == 0);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)&sparseImageTrasferBarrier.subresourceRange.layerCount,
               0xffff,0xffff,0xffff);
    uVar13 = tcu::Vector<unsigned_int,_3>::x
                       ((Vector<unsigned_int,_3> *)
                        &sparseImageTrasferBarrier.subresourceRange.layerCount);
    if (((uVar13 < uVar10) ||
        (uVar13 = tcu::Vector<unsigned_int,_3>::y
                            ((Vector<unsigned_int,_3> *)
                             &sparseImageTrasferBarrier.subresourceRange.layerCount),
        uVar13 < uVar11)) ||
       (uVar13 = tcu::Vector<unsigned_int,_3>::z
                           ((Vector<unsigned_int,_3> *)
                            &sparseImageTrasferBarrier.subresourceRange.layerCount), uVar13 < uVar12
       )) {
      pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar19,"Image size is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                 ,0x1d3);
      __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
    (*(*(_func_int ***)vk_00)[0x5d])(vk_00,*ppVVar27,(ulong)uVar10,(ulong)uVar11,(ulong)uVar12);
    pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_4a8);
    subresourceRange_01.levelCount = VVar40;
    subresourceRange_01.aspectMask =
         imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._4_4_;
    subresourceRange_01.baseMipLevel = uStack_c60;
    subresourceRange_01.baseArrayLayer = dVar9;
    subresourceRange_01.layerCount = subresourceRange.levelCount;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)local_e50,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
               VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pHVar22->m_internal,subresourceRange_01
              );
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
    (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar27,0x800,0x1000,0,0,0,0,0,1,(int)local_e50);
    dVar9 = getNumPixels(this->m_imageType,&this->m_imageSize);
    iVar16 = tcu::getPixelSize(this->m_format);
    uVar10 = dVar9 * iVar16;
    makeBufferCreateInfo
              ((VkBufferCreateInfo *)
               &outputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                m_allocator,(ulong)uVar10,2);
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                       &outputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8,(DeviceInterface *)vk_00,pVVar21,
                       (VkBufferCreateInfo *)
                       &outputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                        m_allocator,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_f00,
               (Move *)&outputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
    uVar38 = (undefined4)local_f00.object.m_internal;
    uVar39 = (undefined4)(local_f00.object.m_internal >> 0x20);
    uVar41 = SUB84(local_f00.deleter.m_deviceIface,0);
    uVar42 = (undefined4)((ulong)local_f00.deleter.m_deviceIface >> 0x20);
    data_11.deleter.m_deviceIface._0_4_ = uVar41;
    data_11.object.m_internal = local_f00.object.m_internal;
    data_11.deleter.m_deviceIface._4_4_ = uVar42;
    data_11.deleter.m_device._0_4_ = (int)local_f00.deleter.m_device;
    data_11.deleter.m_device._4_4_ = (int)((ulong)local_f00.deleter.m_device >> 0x20);
    data_11.deleter.m_allocator._0_4_ = (int)local_f00.deleter.m_allocator;
    data_11.deleter.m_allocator._4_4_ = (int)((ulong)local_f00.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_ee0,data_11);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &outputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    allocator = SparseResourcesBaseInstance::getAllocator(&this->super_SparseResourcesBaseInstance);
    pHVar35 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_ee0);
    bufferImageCopy.imageExtent.depth = ::vk::MemoryRequirement::HostVisible.m_flags;
    this_04 = vk_00;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_f50,
               (DeviceInterface *)vk_00,pVVar21,allocator,(VkBuffer)pHVar35->m_internal,
               ::vk::MemoryRequirement::HostVisible);
    local_f40 = de::details::MovePtr::operator_cast_to_PtrData(&local_f50,this_04);
    data.ptr._4_4_ = uVar39;
    data.ptr._0_4_ = uVar38;
    data._8_4_ = uVar41;
    data._12_4_ = uVar42;
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_f30,data);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_f50);
    VVar37.height = 0;
    VVar37.width = imageCreateInfo.extent.width;
    VVar37.depth = imageCreateInfo.extent.depth;
    makeBufferImageCopy((VkBufferImageCopy *)local_f98,(sparse *)imageCreateInfo._20_8_,VVar37,0,0,
                        CONCAT44(uVar39,uVar38));
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
    pVVar1 = *ppVVar27;
    pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_4a8);
    dVar2 = pHVar22->m_internal;
    pHVar35 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_ee0);
    outputBufferHostReadBarrier.size = pHVar35->m_internal;
    (*(*(_func_int ***)vk_00)[99])
              (vk_00,pVVar1,dVar2,6,outputBufferHostReadBarrier.size,1,(int)local_f98);
    pHVar35 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_ee0);
    VStack_1008.m_internal = pHVar35->m_internal;
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_1000,0x1000,0x2000,VStack_1008,0,(ulong)uVar10);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
    (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar27,0x1000,0x4000,0,0,0,1,(int)local_1000,0,0);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
    endCommandBuffer((DeviceInterface *)vk_00,*ppVVar27);
    local_100c = 0x800;
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pVVar3 = (VkQueue)(sparseImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                      m_allocator)->pUserData;
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_910);
    commandBuffer_00 = *ppVVar27;
    pWaitSemaphores =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                   ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_508);
    submitCommandsAndWait
              ((DeviceInterface *)vk_00,pVVar21,pVVar3,commandBuffer_00,1,pWaitSemaphores,
               &local_100c,0,(VkSemaphore *)0x0);
    pVVar21 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar36 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_f30);
    memory = ::vk::Allocation::getMemory(pAVar36);
    pAVar36 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_f30);
    offset_00 = ::vk::Allocation::getOffset(pAVar36);
    ::vk::invalidateMappedMemoryRange
              ((DeviceInterface *)vk_00,pVVar21,memory,offset_00,(ulong)uVar10);
    pAVar36 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_f30);
    data_12 = ::vk::Allocation::getHostPtr(pAVar36);
    uVar10 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar11 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar12 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&mipExtent_1.depth,&this->m_format,uVar10,uVar11,uVar12,
               data_12);
    (*(*(_func_int ***)vk_00)[3])();
    if (aspectRequirements.formatProperties.imageGranularity.depth == 0) {
      VVar37 = mipLevelExtents((VkExtent3D *)&imageCreateInfo.imageType,0);
      mipExtent_2.width = VVar37.depth;
      for (offsetX_2 = 0; offsetX_2 < mipExtent_2.width * imageCreateInfo.extent.depth;
          offsetX_2 = offsetX_2 + 1) {
        for (referenceValue_2.m_data[3] = 0; uStack_1154 = VVar37.height,
            referenceValue_2.m_data[3] < uStack_1154;
            referenceValue_2.m_data[3] = referenceValue_2.m_data[3] + 1) {
          for (referenceValue_2.m_data[2] = 0; local_1158 = VVar37.width,
              referenceValue_2.m_data[2] < local_1158;
              referenceValue_2.m_data[2] = referenceValue_2.m_data[2] + 1) {
            tcu::Vector<unsigned_int,_4>::Vector
                      ((Vector<unsigned_int,_4> *)(outputValue_2.m_data + 2),
                       referenceValue_2.m_data[2] % 0x7f,referenceValue_2.m_data[3] % 0x7f,
                       offsetX_2 % 0x7f,1);
            tcu::ConstPixelBufferAccess::getPixelUint
                      ((ConstPixelBufferAccess *)local_1194,(int)&mipExtent_1 + 8,
                       referenceValue_2.m_data[2],referenceValue_2.m_data[3]);
            iVar16 = tcu::getNumUsedChannels((this->m_format).order);
            iVar16 = deMemCmp(local_1194,outputValue_2.m_data + 2,(long)iVar16 << 2);
            if (iVar16 != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_11b8,"Failed",&local_11b9);
              tcu::TestStatus::fail(__return_storage_ptr__,&local_11b8);
              std::__cxx11::string::~string((string *)&local_11b8);
              std::allocator<char>::~allocator(&local_11b9);
              goto LAB_00d9d90a;
            }
          }
        }
      }
    }
    else {
      VVar37 = mipLevelExtents((VkExtent3D *)&imageCreateInfo.imageType,0);
      mipExtent_1.width = VVar37.depth;
      local_1058 = VVar37._0_8_;
      alignedDivide((anon_unknown_4 *)(lastBlockExtent_1.m_data + 1),(VkExtent3D *)local_1058,
                    (VkExtent3D *)
                    &deviceMemUniquePtrVec.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((uint)local_1058._0_4_ %
          (uint)deviceMemUniquePtrVec.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
        local_1648 = (uint)deviceMemUniquePtrVec.
                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        local_1648 = (uint)local_1058._0_4_ %
                     (uint)deviceMemUniquePtrVec.
                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      if ((uint)local_1058._4_4_ %
          deviceMemUniquePtrVec.
          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        local_1650 = deviceMemUniquePtrVec.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      else {
        local_1650 = (uint)local_1058._4_4_ %
                     deviceMemUniquePtrVec.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      if (mipExtent_1.width % (uint)uVar7 == 0) {
        local_1658 = uVar7;
      }
      else {
        local_1658 = mipExtent_1.width % (uint)uVar7;
      }
      tcu::Vector<unsigned_int,_3>::Vector
                ((Vector<unsigned_int,_3> *)&z_1,local_1648,local_1650,local_1658);
      for (y_1 = 0; y_1 < imageCreateInfo.extent.depth; y_1 = y_1 + 1) {
        for (x_1 = 0; uVar10 = tcu::Vector<unsigned_int,_3>::z
                                         ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1))
            , x_1 < uVar10; x_1 = x_1 + 1) {
          for (offset_1.depth = 0;
              uVar10 = tcu::Vector<unsigned_int,_3>::y
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1)),
              offset_1.depth < uVar10; offset_1.depth = offset_1.depth + 1) {
            for (offset_1.height = 0;
                uVar10 = tcu::Vector<unsigned_int,_3>::x
                                   ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1)),
                offset_1.height < uVar10; offset_1.height = offset_1.height + 1) {
              uVar10 = offset_1.height *
                       (uint)deviceMemUniquePtrVec.
                             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              uVar11 = offset_1.depth *
                       deviceMemUniquePtrVec.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              uVar12 = tcu::Vector<unsigned_int,_3>::z
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1));
              dVar9 = x_1 * uVar7 + y_1 * uVar12 * uVar7;
              uVar12 = tcu::Vector<unsigned_int,_3>::x
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1));
              if (offset_1.height == uVar12 - 1) {
                local_168c = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&z_1);
              }
              else {
                local_168c = (uint)deviceMemUniquePtrVec.
                                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              }
              uVar12 = tcu::Vector<unsigned_int,_3>::y
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1));
              if (offset_1.depth == uVar12 - 1) {
                local_169c = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&z_1);
              }
              else {
                local_169c = deviceMemUniquePtrVec.
                             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              }
              uVar12 = tcu::Vector<unsigned_int,_3>::z
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1));
              if (x_1 == uVar12 - 1) {
                local_16ac = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)&z_1);
              }
              else {
                local_16ac = uVar7;
              }
              uVar12 = tcu::Vector<unsigned_int,_3>::x
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1));
              uVar13 = tcu::Vector<unsigned_int,_3>::x
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1));
              uVar14 = tcu::Vector<unsigned_int,_3>::y
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1));
              uVar15 = tcu::Vector<unsigned_int,_3>::x
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1));
              uVar17 = tcu::Vector<unsigned_int,_3>::y
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1));
              uVar18 = tcu::Vector<unsigned_int,_3>::z
                                 ((Vector<unsigned_int,_3> *)(lastBlockExtent_1.m_data + 1));
              offsetX = dVar9;
              if ((offset_1.height + offset_1.depth * uVar12 + x_1 * uVar13 * uVar14 +
                   y_1 * uVar15 * uVar17 * uVar18 & 1) == 0) {
                for (; referenceValue.m_data[3] = uVar11, offsetX < dVar9 + local_16ac;
                    offsetX = offsetX + 1) {
                  for (; referenceValue.m_data[2] = uVar10,
                      referenceValue.m_data[3] < uVar11 + local_169c;
                      referenceValue.m_data[3] = referenceValue.m_data[3] + 1) {
                    for (; referenceValue.m_data[2] < uVar10 + local_168c;
                        referenceValue.m_data[2] = referenceValue.m_data[2] + 1) {
                      tcu::Vector<unsigned_int,_4>::Vector
                                ((Vector<unsigned_int,_4> *)(outputValue.m_data + 2),
                                 referenceValue.m_data[2] % 0x7f,referenceValue.m_data[3] % 0x7f,
                                 offsetX % 0x7f,1);
                      tcu::ConstPixelBufferAccess::getPixelUint
                                ((ConstPixelBufferAccess *)local_10d8,(int)&mipExtent_1 + 8,
                                 referenceValue.m_data[2],referenceValue.m_data[3]);
                      iVar16 = tcu::getNumUsedChannels((this->m_format).order);
                      iVar16 = deMemCmp(local_10d8,outputValue.m_data + 2,(long)iVar16 << 2);
                      if (iVar16 != 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&offsetZ_1,"Failed",
                                   (allocator<char> *)((long)&offsetY_1 + 3));
                        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&offsetZ_1);
                        std::__cxx11::string::~string((string *)&offsetZ_1);
                        std::allocator<char>::~allocator((allocator<char> *)((long)&offsetY_1 + 3));
                        goto LAB_00d9d90a;
                      }
                    }
                  }
                }
              }
              else {
                offsetX_1 = dVar9;
                if (physicalDeviceProperties.sparseProperties.residencyStandard3DBlockShape != 0) {
                  for (; referenceValue_1.m_data[3] = uVar11, offsetX_1 < dVar9 + local_16ac;
                      offsetX_1 = offsetX_1 + 1) {
                    for (; referenceValue_1.m_data[2] = uVar10,
                        referenceValue_1.m_data[3] < uVar11 + local_169c;
                        referenceValue_1.m_data[3] = referenceValue_1.m_data[3] + 1) {
                      for (; referenceValue_1.m_data[2] < uVar10 + local_168c;
                          referenceValue_1.m_data[2] = referenceValue_1.m_data[2] + 1) {
                        tcu::Vector<unsigned_int,_4>::Vector
                                  ((Vector<unsigned_int,_4> *)(outputValue_1.m_data + 2),0,0,0,0);
                        tcu::ConstPixelBufferAccess::getPixelUint
                                  ((ConstPixelBufferAccess *)local_1128,(int)&mipExtent_1 + 8,
                                   referenceValue_1.m_data[2],referenceValue_1.m_data[3]);
                        iVar16 = tcu::getNumUsedChannels((this->m_format).order);
                        iVar16 = deMemCmp(local_1128,outputValue_1.m_data + 2,(long)iVar16 << 2);
                        if (iVar16 != 0) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&mipExtent_2.depth,"Failed",
                                     (allocator<char> *)((long)&mipExtent_2.height + 3));
                          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&mipExtent_2.depth)
                          ;
                          std::__cxx11::string::~string((string *)&mipExtent_2.depth);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)((long)&mipExtent_2.height + 3));
                          goto LAB_00d9d90a;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_11e0,"Passed",&local_11e1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_11e0);
    std::__cxx11::string::~string((string *)&local_11e0);
    std::allocator<char>::~allocator(&local_11e1);
LAB_00d9d90a:
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_f30);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_ee0);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_c88);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_c00);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_b88);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_b10);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_aa8);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_978);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_910);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_8b0);
  }
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_508);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_4a8);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
             *)local_410);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageSparseResidencyInstance::iterate (void)
{
	const InstanceInterface&			instance = m_context.getInstanceInterface();
	const VkPhysicalDevice				physicalDevice = m_context.getPhysicalDevice();
	const VkPhysicalDeviceProperties	physicalDeviceProperties = getPhysicalDeviceProperties(instance, physicalDevice);
	VkImageCreateInfo					imageCreateInfo;
	VkSparseImageMemoryRequirements		aspectRequirements;
	VkExtent3D							imageGranularity;
	std::vector<DeviceMemorySp>			deviceMemUniquePtrVec;

	// Check if image size does not exceed device limits
	if (!isImageSizeSupported(instance, physicalDevice, m_imageType, m_imageSize))
		TCU_THROW(NotSupportedError, "Image size not supported for device");

	// Check if device supports sparse operations for image type
	if (!checkSparseSupportForImageType(instance, physicalDevice, m_imageType))
		TCU_THROW(NotSupportedError, "Sparse residency for image type is not supported");

	imageCreateInfo.sType					= VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
	imageCreateInfo.pNext					= DE_NULL;
	imageCreateInfo.flags					= VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT | VK_IMAGE_CREATE_SPARSE_BINDING_BIT;
	imageCreateInfo.imageType				= mapImageType(m_imageType);
	imageCreateInfo.format					= mapTextureFormat(m_format);
	imageCreateInfo.extent					= makeExtent3D(getLayerSize(m_imageType, m_imageSize));
	imageCreateInfo.mipLevels				= 1u;
	imageCreateInfo.arrayLayers				= getNumLayers(m_imageType, m_imageSize);
	imageCreateInfo.samples					= VK_SAMPLE_COUNT_1_BIT;
	imageCreateInfo.tiling					= VK_IMAGE_TILING_OPTIMAL;
	imageCreateInfo.initialLayout			= VK_IMAGE_LAYOUT_UNDEFINED;
	imageCreateInfo.usage					= VK_IMAGE_USAGE_TRANSFER_SRC_BIT |
											  VK_IMAGE_USAGE_STORAGE_BIT;
	imageCreateInfo.sharingMode				= VK_SHARING_MODE_EXCLUSIVE;
	imageCreateInfo.queueFamilyIndexCount	= 0u;
	imageCreateInfo.pQueueFamilyIndices		= DE_NULL;

	if (m_imageType == IMAGE_TYPE_CUBE || m_imageType == IMAGE_TYPE_CUBE_ARRAY)
	{
		imageCreateInfo.flags |= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
	}

	// Check if device supports sparse operations for image format
	if (!checkSparseSupportForImageFormat(instance, physicalDevice, imageCreateInfo))
		TCU_THROW(NotSupportedError, "The image format does not support sparse operations");

	{
		// Create logical device supporting both sparse and compute queues
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	// Create sparse image
	const Unique<VkImage> sparseImage(createImage(deviceInterface, getDevice(), &imageCreateInfo));

	// Create sparse image memory bind semaphore
	const Unique<VkSemaphore> imageMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	{
		// Get image general memory requirements
		const VkMemoryRequirements imageMemoryRequirements = getImageMemoryRequirements(deviceInterface, getDevice(), *sparseImage);

		if (imageMemoryRequirements.size > physicalDeviceProperties.limits.sparseAddressSpaceSize)
			TCU_THROW(NotSupportedError, "Required memory size for sparse resource exceeds device limits");

		DE_ASSERT((imageMemoryRequirements.size % imageMemoryRequirements.alignment) == 0);

		// Get sparse image sparse memory requirements
		const std::vector<VkSparseImageMemoryRequirements> sparseMemoryRequirements = getImageSparseMemoryRequirements(deviceInterface, getDevice(), *sparseImage);

		DE_ASSERT(sparseMemoryRequirements.size() != 0);

		const deUint32 colorAspectIndex = getSparseAspectRequirementsIndex(sparseMemoryRequirements, VK_IMAGE_ASPECT_COLOR_BIT);

		if (colorAspectIndex == NO_MATCH_FOUND)
			TCU_THROW(NotSupportedError, "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT");

		aspectRequirements	= sparseMemoryRequirements[colorAspectIndex];
		imageGranularity	= aspectRequirements.formatProperties.imageGranularity;

		const VkImageAspectFlags aspectMask = aspectRequirements.formatProperties.aspectMask;

		DE_ASSERT((aspectRequirements.imageMipTailSize % imageMemoryRequirements.alignment) == 0);

		std::vector<VkSparseImageMemoryBind> imageResidencyMemoryBinds;
		std::vector<VkSparseMemoryBind>		 imageMipTailMemoryBinds;

		const deUint32						 memoryType = findMatchingMemoryType(instance, physicalDevice, imageMemoryRequirements, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		// Bind device memory for each aspect
		for (deUint32 layerNdx = 0; layerNdx < imageCreateInfo.arrayLayers; ++layerNdx)
		{
			for (deUint32 mipLevelNdx = 0; mipLevelNdx < aspectRequirements.imageMipTailFirstLod; ++mipLevelNdx)
			{
				const VkImageSubresource subresource		= { aspectMask, mipLevelNdx, layerNdx };
				const VkExtent3D		 mipExtent			= mipLevelExtents(imageCreateInfo.extent, mipLevelNdx);
				const tcu::UVec3		 numSparseBinds		= alignedDivide(mipExtent, imageGranularity);
				const tcu::UVec3		 lastBlockExtent	= tcu::UVec3(mipExtent.width  % imageGranularity.width  ? mipExtent.width   % imageGranularity.width  : imageGranularity.width,
																		 mipExtent.height % imageGranularity.height ? mipExtent.height  % imageGranularity.height : imageGranularity.height,
																		 mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth   % imageGranularity.depth  : imageGranularity.depth);
				for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
				for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
				for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
				{
					const deUint32 linearIndex = x + y*numSparseBinds.x() + z*numSparseBinds.x()*numSparseBinds.y() + layerNdx*numSparseBinds.x()*numSparseBinds.y()*numSparseBinds.z();

					if (linearIndex % 2u == 1u)
					{
						continue;
					}

					VkOffset3D offset;
					offset.x = x*imageGranularity.width;
					offset.y = y*imageGranularity.height;
					offset.z = z*imageGranularity.depth;

					VkExtent3D extent;
					extent.width  = (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
					extent.height = (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
					extent.depth  = (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

					const VkSparseImageMemoryBind imageMemoryBind = makeSparseImageMemoryBind(deviceInterface, getDevice(),
						imageMemoryRequirements.alignment, memoryType, subresource, offset, extent);

					deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

					imageResidencyMemoryBinds.push_back(imageMemoryBind);
				}
			}

			if (!(aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) && aspectRequirements.imageMipTailFirstLod < imageCreateInfo.mipLevels)
			{
				const VkSparseMemoryBind imageMipTailMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(),
					aspectRequirements.imageMipTailSize, memoryType, aspectRequirements.imageMipTailOffset + layerNdx * aspectRequirements.imageMipTailStride);

				deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMipTailMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

				imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
			}
		}

		if ((aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) && aspectRequirements.imageMipTailFirstLod < imageCreateInfo.mipLevels)
		{
			const VkSparseMemoryBind imageMipTailMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(),
				aspectRequirements.imageMipTailSize, memoryType, aspectRequirements.imageMipTailOffset);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMipTailMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
		}

		VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			0u,											//deUint32									bufferBindCount;
			DE_NULL,									//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&imageMemoryBindSemaphore.get()				//const VkSemaphore*						pSignalSemaphores;
		};

		VkSparseImageMemoryBindInfo		  imageResidencyBindInfo;
		VkSparseImageOpaqueMemoryBindInfo imageMipTailBindInfo;

		if (imageResidencyMemoryBinds.size() > 0)
		{
			imageResidencyBindInfo.image		= *sparseImage;
			imageResidencyBindInfo.bindCount	= static_cast<deUint32>(imageResidencyMemoryBinds.size());
			imageResidencyBindInfo.pBinds		= &imageResidencyMemoryBinds[0];

			bindSparseInfo.imageBindCount		= 1u;
			bindSparseInfo.pImageBinds			= &imageResidencyBindInfo;
		}

		if (imageMipTailMemoryBinds.size() > 0)
		{
			imageMipTailBindInfo.image			= *sparseImage;
			imageMipTailBindInfo.bindCount		= static_cast<deUint32>(imageMipTailMemoryBinds.size());
			imageMipTailBindInfo.pBinds			= &imageMipTailMemoryBinds[0];

			bindSparseInfo.imageOpaqueBindCount = 1u;
			bindSparseInfo.pImageOpaqueBinds	= &imageMipTailBindInfo;
		}

		// Submit sparse bind commands for execution
		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create command buffer for compute and transfer oparations
	const Unique<VkCommandPool>	  commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer> commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	// Create descriptor set layout
	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(deviceInterface, getDevice()));

	// Create and bind compute pipeline
	const Unique<VkShaderModule>	shaderModule(createShaderModule(deviceInterface, getDevice(), m_context.getBinaryCollection().get("comp"), DE_NULL));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout(deviceInterface, getDevice(), *descriptorSetLayout));
	const Unique<VkPipeline>		computePipeline(makeComputePipeline(deviceInterface, getDevice(), *pipelineLayout, *shaderModule));

	deviceInterface.cmdBindPipeline(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);

	// Create and bind descriptor set
	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, 1u)
		.build(deviceInterface, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet>	descriptorSet(makeDescriptorSet(deviceInterface, getDevice(), *descriptorPool, *descriptorSetLayout));

	const VkImageSubresourceRange	subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));
	const Unique<VkImageView>		imageView(makeImageView(deviceInterface, getDevice(), *sparseImage, mapImageViewType(m_imageType), mapTextureFormat(m_format), subresourceRange));
	const VkDescriptorImageInfo		sparseImageInfo  = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &sparseImageInfo)
		.update(deviceInterface, getDevice());

	deviceInterface.cmdBindDescriptorSets(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	{
		const VkImageMemoryBarrier sparseImageLayoutChangeBarrier = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_GENERAL,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? sparseQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? computeQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			*sparseImage,
			subresourceRange
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &sparseImageLayoutChangeBarrier);
	}

	const tcu::UVec3  gridSize = getShaderGridSize(m_imageType, m_imageSize);

	{
		const tcu::UVec3  workGroupSize = computeWorkGroupSize(gridSize);

		const deUint32 xWorkGroupCount = gridSize.x() / workGroupSize.x() + (gridSize.x() % workGroupSize.x() ? 1u : 0u);
		const deUint32 yWorkGroupCount = gridSize.y() / workGroupSize.y() + (gridSize.y() % workGroupSize.y() ? 1u : 0u);
		const deUint32 zWorkGroupCount = gridSize.z() / workGroupSize.z() + (gridSize.z() % workGroupSize.z() ? 1u : 0u);

		const tcu::UVec3 maxComputeWorkGroupCount = tcu::UVec3(65535u, 65535u, 65535u);

		if (maxComputeWorkGroupCount.x() < xWorkGroupCount ||
			maxComputeWorkGroupCount.y() < yWorkGroupCount ||
			maxComputeWorkGroupCount.z() < zWorkGroupCount)
		{
			TCU_THROW(NotSupportedError, "Image size is not supported");
		}

		deviceInterface.cmdDispatch(*commandBuffer, xWorkGroupCount, yWorkGroupCount, zWorkGroupCount);
	}

	{
		const VkImageMemoryBarrier sparseImageTrasferBarrier = makeImageMemoryBarrier
		(
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*sparseImage,
			subresourceRange
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &sparseImageTrasferBarrier);
	}

	const deUint32					imageSizeInBytes		= getNumPixels(m_imageType, m_imageSize) * tcu::getPixelSize(m_format);
	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	{
		const VkBufferImageCopy bufferImageCopy = makeBufferImageCopy(imageCreateInfo.extent, imageCreateInfo.arrayLayers);

		deviceInterface.cmdCopyImageToBuffer(*commandBuffer, *sparseImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, 1u, &bufferImageCopy);
	}

	{
		const VkBufferMemoryBarrier outputBufferHostReadBarrier = makeBufferMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_HOST_READ_BIT,
			*outputBuffer,
			0u,
			imageSizeInBytes
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferHostReadBarrier, 0u, DE_NULL);
	}

	// End recording commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	// The stage at which execution is going to wait for finish of sparse binding operations
	const VkPipelineStageFlags stageBits[] = { VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT };

	// Submit commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &imageMemoryBindSemaphore.get(), stageBits);

	// Retrieve data from buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), imageSizeInBytes);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());
	const tcu::ConstPixelBufferAccess pixelBuffer = tcu::ConstPixelBufferAccess(m_format, gridSize.x(), gridSize.y(), gridSize.z(), outputData);

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	// Validate results
	if( aspectRequirements.imageMipTailFirstLod > 0u )
	{
		const VkExtent3D		 mipExtent		 = mipLevelExtents(imageCreateInfo.extent, 0u);
		const tcu::UVec3		 numSparseBinds  = alignedDivide(mipExtent, imageGranularity);
		const tcu::UVec3		 lastBlockExtent = tcu::UVec3(	mipExtent.width  % imageGranularity.width  ? mipExtent.width  % imageGranularity.width  : imageGranularity.width,
																mipExtent.height % imageGranularity.height ? mipExtent.height % imageGranularity.height : imageGranularity.height,
																mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth  % imageGranularity.depth  : imageGranularity.depth);

		for (deUint32 layerNdx = 0; layerNdx < imageCreateInfo.arrayLayers; ++layerNdx)
		{
			for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
			for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
			for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
			{
				VkExtent3D offset;
				offset.width  = x*imageGranularity.width;
				offset.height = y*imageGranularity.height;
				offset.depth  = z*imageGranularity.depth + layerNdx*numSparseBinds.z()*imageGranularity.depth;

				VkExtent3D extent;
				extent.width  = (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
				extent.height = (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
				extent.depth  = (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

				const deUint32 linearIndex = x + y*numSparseBinds.x() + z*numSparseBinds.x()*numSparseBinds.y() + layerNdx*numSparseBinds.x()*numSparseBinds.y()*numSparseBinds.z();

				if (linearIndex % 2u == 0u)
				{
					for (deUint32 offsetZ = offset.depth;  offsetZ < offset.depth  + extent.depth;  ++offsetZ)
					for (deUint32 offsetY = offset.height; offsetY < offset.height + extent.height; ++offsetY)
					for (deUint32 offsetX = offset.width;  offsetX < offset.width  + extent.width;  ++offsetX)
					{
						const tcu::UVec4 referenceValue = tcu::UVec4(offsetX % 127u, offsetY % 127u, offsetZ % 127u, 1u);
						const tcu::UVec4 outputValue	= pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

						if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
							return tcu::TestStatus::fail("Failed");
					}
				}
				else if (physicalDeviceProperties.sparseProperties.residencyNonResidentStrict)
				{
					for (deUint32 offsetZ = offset.depth;  offsetZ < offset.depth  + extent.depth;  ++offsetZ)
					for (deUint32 offsetY = offset.height; offsetY < offset.height + extent.height; ++offsetY)
					for (deUint32 offsetX = offset.width;  offsetX < offset.width  + extent.width;  ++offsetX)
					{
						const tcu::UVec4 referenceValue = tcu::UVec4(0u, 0u, 0u, 0u);
						const tcu::UVec4 outputValue = pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

						if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
							return tcu::TestStatus::fail("Failed");
					}
				}
			}
		}
	}
	else
	{
		const VkExtent3D mipExtent = mipLevelExtents(imageCreateInfo.extent, 0u);

		for (deUint32 offsetZ = 0u; offsetZ < mipExtent.depth * imageCreateInfo.arrayLayers; ++offsetZ)
		for (deUint32 offsetY = 0u; offsetY < mipExtent.height; ++offsetY)
		for (deUint32 offsetX = 0u; offsetX < mipExtent.width;  ++offsetX)
		{
			const tcu::UVec4 referenceValue = tcu::UVec4(offsetX % 127u, offsetY % 127u, offsetZ % 127u, 1u);
			const tcu::UVec4 outputValue	= pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

			if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
				return tcu::TestStatus::fail("Failed");
		}
	}

	return tcu::TestStatus::pass("Passed");
}